

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
* __thiscall
helics::CloneFilterOperation::sendMessage
          (vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
           *__return_storage_ptr__,CloneFilterOperation *this,Message *mess)

{
  pointer pbVar1;
  Message *pMVar2;
  pointer __str;
  Message *local_40;
  pthread_rwlock_t *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = (pthread_rwlock_t *)&(this->deliveryAddresses).m_mutex;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_38->__data);
  __str = (this->deliveryAddresses).m_obj.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (this->deliveryAddresses).m_obj.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__str != pbVar1) {
    do {
      pMVar2 = (Message *)operator_new(0x100);
      Message::Message(pMVar2,mess);
      local_40 = pMVar2;
      std::
      vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
      ::emplace_back<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>
                ((vector<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>,std::allocator<std::unique_ptr<helics::Message,std::default_delete<helics::Message>>>>
                  *)__return_storage_ptr__,
                 (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_40);
      if (local_40 != (Message *)0x0) {
        CLI::std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_40,local_40);
      }
      pMVar2 = (__return_storage_ptr__->
               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t.
               super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
               super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&pMVar2->original_dest,&pMVar2->dest);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(&((__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
                  .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
                  super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->dest,__str);
      __str = __str + 1;
    } while (__str != pbVar1);
  }
  pthread_rwlock_unlock(local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<Message>> CloneFilterOperation::sendMessage(const Message* mess) const
{
    std::vector<std::unique_ptr<Message>> messages;
    auto lock = deliveryAddresses.lock_shared();
    for (const auto& add : *lock) {
        messages.push_back(std::make_unique<Message>(*mess));
        messages.back()->original_dest = messages.back()->dest;
        messages.back()->dest = add;
    }
    return messages;
}